

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

void __thiscall BamTools::FilterTool::~FilterTool(FilterTool *this)

{
  _func_int **pp_Var1;
  AbstractTool *in_RDI;
  FilterSettings *in_stack_ffffffffffffffe0;
  FilterToolPrivate *this_00;
  
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__FilterTool_0033ee28;
  pp_Var1 = in_RDI[1]._vptr_AbstractTool;
  if (pp_Var1 != (_func_int **)0x0) {
    FilterSettings::~FilterSettings(in_stack_ffffffffffffffe0);
    operator_delete(pp_Var1);
  }
  in_RDI[1]._vptr_AbstractTool = (_func_int **)0x0;
  this_00 = (FilterToolPrivate *)in_RDI[2]._vptr_AbstractTool;
  if (this_00 != (FilterToolPrivate *)0x0) {
    FilterToolPrivate::~FilterToolPrivate(this_00);
    operator_delete(this_00);
  }
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  AbstractTool::~AbstractTool(in_RDI);
  return;
}

Assistant:

FilterTool::~FilterTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}